

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.h
# Opt level: O0

void set_max_min_partition_size
               (SuperBlockEnc *sb_enc,AV1_COMP *cpi,MACROBLOCK *x,SPEED_FEATURES *sf,
               BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  BLOCK_SIZE BVar1;
  BLOCK_SIZE BVar2;
  int iVar3;
  MACROBLOCK *x_00;
  long in_RCX;
  long in_RSI;
  BLOCK_SIZE *in_RDI;
  undefined1 in_R8B;
  undefined4 in_R9D;
  float features [13];
  AV1_COMMON *cm;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  BLOCK_SIZE sb_size_00;
  BLOCK_SIZE local_78;
  BLOCK_SIZE local_70;
  undefined1 local_68 [48];
  float *in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffdc;
  undefined4 uVar4;
  
  sb_size_00 = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff7c >> 0x18);
  uVar4 = CONCAT13(in_R8B,in_stack_ffffffffffffffdc);
  x_00 = (MACROBLOCK *)(in_RSI + 0x3bf80);
  BVar2 = *(BLOCK_SIZE *)(in_RCX + 0xab);
  BVar1 = dim_to_size((uint)*(byte *)(in_RSI + 0x42702));
  if (BVar2 < BVar1) {
    local_70 = *(BLOCK_SIZE *)(in_RCX + 0xab);
  }
  else {
    local_70 = dim_to_size((uint)*(byte *)(in_RSI + 0x42702));
  }
  in_RDI[1] = local_70;
  BVar2 = *(BLOCK_SIZE *)(in_RCX + 0xaa);
  BVar1 = dim_to_size((uint)*(byte *)(in_RSI + 0x42701));
  if (BVar1 < BVar2) {
    local_78 = *(BLOCK_SIZE *)(in_RCX + 0xaa);
  }
  else {
    local_78 = dim_to_size((uint)*(byte *)(in_RSI + 0x42701));
  }
  *in_RDI = local_78;
  if (in_RDI[1] < *(BLOCK_SIZE *)(*(long *)(x_00->mode_costs).y_mode_costs[10][0] + 0x1c)) {
    BVar2 = in_RDI[1];
  }
  else {
    BVar2 = *(BLOCK_SIZE *)(*(long *)(x_00->mode_costs).y_mode_costs[10][0] + 0x1c);
  }
  in_RDI[1] = BVar2;
  if (*in_RDI < *(BLOCK_SIZE *)(*(long *)(x_00->mode_costs).y_mode_costs[10][0] + 0x1c)) {
    BVar1 = *in_RDI;
  }
  else {
    BVar1 = *(BLOCK_SIZE *)(*(long *)(x_00->mode_costs).y_mode_costs[10][0] + 0x1c);
  }
  *in_RDI = BVar1;
  iVar3 = use_auto_max_partition
                    ((AV1_COMP *)(ulong)CONCAT14(BVar2,(uint)BVar1),sb_size_00,
                     in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  if (iVar3 != 0) {
    memset(local_68,0,0x34);
    av1_get_max_min_partition_features
              (stack0x00000060,(MACROBLOCK *)features._40_8_,(int)features[9],(int)features[8],
               (float *)features._24_8_);
    BVar2 = av1_predict_max_partition
                      ((AV1_COMP *)CONCAT44(uVar4,in_R9D),x_00,in_stack_ffffffffffffffc8);
    if (BVar2 < in_RDI[1]) {
      BVar2 = av1_predict_max_partition
                        ((AV1_COMP *)CONCAT44(uVar4,in_R9D),x_00,in_stack_ffffffffffffffc8);
    }
    else {
      BVar2 = in_RDI[1];
    }
    if (*in_RDI < BVar2) {
      BVar2 = av1_predict_max_partition
                        ((AV1_COMP *)CONCAT44(uVar4,in_R9D),x_00,in_stack_ffffffffffffffc8);
      if (BVar2 < in_RDI[1]) {
        BVar2 = av1_predict_max_partition
                          ((AV1_COMP *)CONCAT44(uVar4,in_R9D),x_00,in_stack_ffffffffffffffc8);
      }
      else {
        BVar2 = in_RDI[1];
      }
    }
    else {
      BVar2 = *in_RDI;
    }
    in_RDI[1] = BVar2;
  }
  return;
}

Assistant:

static inline void set_max_min_partition_size(SuperBlockEnc *sb_enc,
                                              AV1_COMP *cpi, MACROBLOCK *x,
                                              const SPEED_FEATURES *sf,
                                              BLOCK_SIZE sb_size, int mi_row,
                                              int mi_col) {
  const AV1_COMMON *cm = &cpi->common;

  sb_enc->max_partition_size =
      AOMMIN(sf->part_sf.default_max_partition_size,
             dim_to_size(cpi->oxcf.part_cfg.max_partition_size));
  sb_enc->min_partition_size =
      AOMMAX(sf->part_sf.default_min_partition_size,
             dim_to_size(cpi->oxcf.part_cfg.min_partition_size));
  sb_enc->max_partition_size =
      AOMMIN(sb_enc->max_partition_size, cm->seq_params->sb_size);
  sb_enc->min_partition_size =
      AOMMIN(sb_enc->min_partition_size, cm->seq_params->sb_size);

  if (use_auto_max_partition(cpi, sb_size, mi_row, mi_col)) {
    float features[FEATURE_SIZE_MAX_MIN_PART_PRED] = { 0.0f };

    av1_get_max_min_partition_features(cpi, x, mi_row, mi_col, features);
    sb_enc->max_partition_size =
        AOMMAX(AOMMIN(av1_predict_max_partition(cpi, x, features),
                      sb_enc->max_partition_size),
               sb_enc->min_partition_size);
  }
}